

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qudpsocket.cpp
# Opt level: O3

QNetworkDatagram __thiscall QUdpSocket::receiveDatagram(QUdpSocket *this,qint64 maxSize)

{
  QAbstractSocketPrivate *this_00;
  QAbstractSocketEngine *pQVar1;
  undefined8 *puVar2;
  bool bVar3;
  SocketError errorCode;
  long lVar4;
  undefined8 *puVar5;
  long in_RDX;
  long in_FS_OFFSET;
  QHostAddress QStack_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketPrivate **)(maxSize + 8);
  bVar3 = QAbstractSocket::isValid((QAbstractSocket *)maxSize);
  if (bVar3) {
    if ((in_RDX < 0) &&
       (in_RDX = (**(code **)(*(long *)this_00->socketEngine + 0xf0))(), in_RDX < 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QNetworkDatagram::QNetworkDatagram((QNetworkDatagram *)this);
        return (QNetworkDatagram)(QNetworkDatagramPrivate *)this;
      }
      goto LAB_001c891b;
    }
    *(undefined1 **)&this->super_QAbstractSocket = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)&local_50,in_RDX,Uninitialized);
    QHostAddress::QHostAddress(&QStack_58);
    QNetworkDatagram::QNetworkDatagram
              ((QNetworkDatagram *)this,(QByteArray *)&local_50,&QStack_58,0);
    QHostAddress::~QHostAddress(&QStack_58);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
      }
    }
    pQVar1 = this_00->socketEngine;
    puVar2 = *(undefined8 **)&this->super_QAbstractSocket;
    if (((int *)*puVar2 == (int *)0x0) || (puVar5 = puVar2, 1 < *(int *)*puVar2)) {
      QByteArray::reallocData((longlong)puVar2,(AllocationOption)puVar2[2]);
      puVar5 = *(undefined8 **)&this->super_QAbstractSocket;
    }
    lVar4 = (**(code **)(*(long *)pQVar1 + 0xf8))(pQVar1,puVar2[1],in_RDX,puVar5 + 3,0xff);
    this_00->hasPendingData = false;
    this_00->hasPendingDatagram = false;
    (**(code **)(*(long *)this_00->socketEngine + 0x140))(this_00->socketEngine,1);
    if (lVar4 < 0) {
      errorCode = QAbstractSocketEngine::error((QAbstractSocketEngine *)this_00->socketEngine);
      QAbstractSocketEngine::errorString(&local_50,(QAbstractSocketEngine *)this_00->socketEngine);
      QAbstractSocketPrivate::setErrorAndEmit(this_00,errorCode,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QByteArray::truncate(*(longlong *)&this->super_QAbstractSocket);
  }
  else {
    receiveDatagram(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QNetworkDatagram)(QNetworkDatagramPrivate *)this;
  }
LAB_001c891b:
  __stack_chk_fail();
}

Assistant:

QNetworkDatagram QUdpSocket::receiveDatagram(qint64 maxSize)
{
    Q_D(QUdpSocket);

#if defined QUDPSOCKET_DEBUG
    qDebug("QUdpSocket::receiveDatagram(%lld)", maxSize);
#endif
    QT_CHECK_BOUND("QUdpSocket::receiveDatagram()", QNetworkDatagram());

    if (maxSize < 0)
        maxSize = d->socketEngine->pendingDatagramSize();
    if (maxSize < 0)
        return QNetworkDatagram();

    QNetworkDatagram result(QByteArray(maxSize, Qt::Uninitialized));
    qint64 readBytes = d->socketEngine->readDatagram(result.d->data.data(), maxSize, &result.d->header,
                                                     QAbstractSocketEngine::WantAll);
    d->hasPendingData = false;
    d->hasPendingDatagram = false;
    d->socketEngine->setReadNotificationEnabled(true);
    if (readBytes < 0) {
        d->setErrorAndEmit(d->socketEngine->error(), d->socketEngine->errorString());
        readBytes = 0;
    }

    result.d->data.truncate(readBytes);
    return result;
}